

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<3UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  bool bVar1;
  list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_> *in_RDI;
  MM<6UL> *in_stack_00000008;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000010;
  const_iterator iter;
  _List_const_iterator<GF2::MM<3UL>_> *in_stack_ffffffffffffffc0;
  _Self local_28;
  _List_node_base *local_20;
  _List_const_iterator<GF2::MM<3UL>_> local_18 [3];
  
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::list
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)0x18e8ec);
  std::_List_const_iterator<GF2::MM<3UL>_>::_List_const_iterator(local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>::begin(in_RDI);
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>::end(in_RDI);
    bVar1 = std::operator!=(local_18,&local_28);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<3UL>_>::operator*(in_stack_ffffffffffffffc0);
    MM<6ul>::MM<3ul>((MM<6UL> *)in_stack_ffffffffffffffc0,(MM<3UL> *)in_RDI);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiff(in_stack_00000010,in_stack_00000008);
    std::_List_const_iterator<GF2::MM<3UL>_>::operator++(local_18);
  }
  return;
}

Assistant:

MP(const MP<_m, _O1>& polyRight) 
	{	
		typename MP<_m, _O1>::const_iterator iter;
		for (iter = polyRight.begin(); iter != polyRight.end(); ++iter)
			SymDiff(MM<_n>(*iter));
	}